

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O2

void __thiscall
btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btCapsuleShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btVector3 *v;
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 in_XMM1_Dc;
  undefined4 uVar7;
  undefined4 in_XMM1_Dd;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 bVar13;
  btScalar local_90;
  btScalar radius;
  btScalar local_88 [2];
  undefined8 uStack_80;
  btVector3 *local_70;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  float local_48;
  btScalar bStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  radius = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats
           [(*(int *)&(this->super_btConvexInternalShape).field_0x44 + 2) % 3];
  uVar5 = 0;
  uVar4 = (ulong)(uint)numVectors;
  if (numVectors < 1) {
    uVar4 = uVar5;
  }
  local_70 = supportVerticesOut;
  for (; uVar4 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
    v = (btVector3 *)((long)vectors->m_floats + uVar5);
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    uStack_80 = 0;
    iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
    local_88[iVar1] = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1];
    bVar13 = operator*(v,&radius);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_8_ = bVar13.m_floats._0_8_;
    local_58._12_4_ = extraout_XMM0_Dd;
    local_68._4_4_ = bVar13.m_floats[3];
    local_68._0_4_ = bVar13.m_floats[2] + (float)uStack_80;
    uStack_60 = in_XMM1_Dc;
    uStack_5c = in_XMM1_Dd;
    (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(this);
    bVar13 = operator*(v,&local_90);
    fVar9 = (local_88[0] + (float)local_58._0_4_) - bVar13.m_floats[0];
    fVar11 = (local_88[1] + (float)local_58._4_4_) - bVar13.m_floats[1];
    fVar12 = (float)local_68._0_4_ - bVar13.m_floats[2];
    fVar6 = *(float *)((long)vectors->m_floats + uVar5 + 8) * fVar12 +
            *(float *)((long)vectors->m_floats + uVar5) * fVar9 +
            fVar11 * *(float *)((long)vectors->m_floats + uVar5 + 4);
    fVar10 = -1e+18;
    if (-1e+18 < fVar6) {
      auVar2._4_4_ = fVar11;
      auVar2._0_4_ = fVar9;
      auVar2._8_4_ = fVar12;
      auVar2._12_4_ = 0;
      *(undefined1 (*) [16])((long)local_70->m_floats + uVar5) = auVar2;
      fVar10 = fVar6;
    }
    uVar8 = 0;
    uVar7 = 0;
    local_58._0_4_ = fVar10;
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    uStack_80 = 0;
    iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
    local_88[iVar1] = -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1]
    ;
    bVar13 = operator*(v,&radius);
    bStack_44 = bVar13.m_floats[3];
    uStack_60 = extraout_XMM0_Dc_00;
    local_68 = (undefined1  [8])bVar13.m_floats._0_8_;
    uStack_5c = extraout_XMM0_Dd_00;
    local_48 = bVar13.m_floats[2] + (float)uStack_80;
    uStack_40 = uVar7;
    uStack_3c = uVar8;
    (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(this);
    bVar13 = operator*(v,&local_90);
    fVar10 = (local_88[0] + (float)local_68._0_4_) - bVar13.m_floats[0];
    fVar6 = (local_88[1] + (float)local_68._4_4_) - bVar13.m_floats[1];
    fVar9 = local_48 - bVar13.m_floats[2];
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if ((float)local_58._0_4_ <
        *(float *)((long)vectors->m_floats + uVar5 + 8) * fVar9 +
        *(float *)((long)vectors->m_floats + uVar5) * fVar10 +
        fVar6 * *(float *)((long)vectors->m_floats + uVar5 + 4)) {
      auVar3._4_4_ = fVar6;
      auVar3._0_4_ = fVar10;
      auVar3._8_4_ = fVar9;
      auVar3._12_4_ = 0;
      *(undefined1 (*) [16])((long)local_70->m_floats + uVar5) = auVar3;
    }
  }
  return;
}

Assistant:

void	btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	
	btScalar radius = getRadius();

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));
		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = -getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		
	}
}